

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hpp
# Opt level: O2

StreamException * __thiscall
Centaurus::Stream::unexpected(StreamException *__return_storage_ptr__,Stream *this,wchar_t ch)

{
  ostream *poVar1;
  long *plVar2;
  ostringstream stream;
  string sStack_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"Line ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_line);
  poVar1 = std::operator<<(poVar1,", Pos ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_pos);
  poVar1 = std::operator<<(poVar1,": Unexpected character ");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  plVar2 = (long *)std::ostream::operator<<(poVar1,ch);
  *(uint *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x18) =
       *(uint *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::__cxx11::stringbuf::str();
  StreamException::StreamException(__return_storage_ptr__,&sStack_1b8);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

StreamException unexpected(wchar_t ch)
    {
        std::ostringstream stream;

        stream << "Line " << m_line << ", Pos " << m_pos << ": Unexpected character " << std::hex << (int)ch << std::dec;

        return StreamException(stream.str());
    }